

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteAdder(FILE *pFile,int nVars)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)nVars;
  if (1 < (uint)nVars) {
    uVar5 = 0;
    uVar3 = nVars - 1;
    if (uVar3 != 0) {
      do {
        uVar5 = (ulong)((int)uVar5 + 1);
        bVar1 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar1);
    }
  }
  if (nVars < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcGen.c"
                  ,0x5a,"void Abc_WriteAdder(FILE *, int)");
  }
  fprintf((FILE *)pFile,".model ADD%d\n",(ulong)(uint)nVars);
  fwrite(".inputs",7,1,(FILE *)pFile);
  uVar4 = 0;
  do {
    fprintf((FILE *)pFile," a%0*d",uVar5,uVar4);
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (nVars != uVar3);
  uVar3 = 0;
  do {
    fprintf((FILE *)pFile," b%0*d",uVar5,(ulong)uVar3);
    uVar3 = uVar3 + 1;
  } while (nVars != uVar3);
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  uVar3 = 0;
  do {
    fprintf((FILE *)pFile," s%0*d",uVar5,(ulong)uVar3);
    uVar3 = uVar3 + 1;
  } while (nVars + 1U != uVar3);
  fputc(10,(FILE *)pFile);
  fwrite(".names c\n",9,1,(FILE *)pFile);
  if (nVars == 1) {
    fwrite(".subckt FA a=a0 b=b0 cin=c s=y0 cout=s1\n",0x28,1,(FILE *)pFile);
  }
  else {
    fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=c s=s%0*d cout=%0*d\n",uVar5,0,uVar5,0,
            uVar5,0,uVar5,0);
    uVar4 = 1;
    if (2 < nVars) {
      uVar4 = 1;
      do {
        iVar2 = (int)uVar4;
        fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=%0*d\n",uVar5,uVar4,
                uVar5,uVar4,uVar5,(ulong)(iVar2 - 1),uVar5,uVar4,uVar5,uVar4);
        uVar4 = (ulong)(iVar2 + 1);
      } while (iVar2 != nVars + -2);
    }
    fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=s%0*d\n",uVar5,uVar4,
            uVar5,uVar4,uVar5,(ulong)((int)uVar4 - 1),uVar5,uVar4,uVar5,(ulong)((int)uVar4 + 1));
  }
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  Abc_WriteFullAdder(pFile);
  return;
}

Assistant:

void Abc_WriteAdder( FILE * pFile, int nVars )
{
    int i, nDigits = Abc_Base10Log( nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model ADD%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i <= nVars; i++ )
        fprintf( pFile, " s%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".names c\n" );
    if ( nVars == 1 )
        fprintf( pFile, ".subckt FA a=a0 b=b0 cin=c s=y0 cout=s1\n" );
    else
    {
        fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=c s=s%0*d cout=%0*d\n", nDigits, 0, nDigits, 0, nDigits, 0, nDigits, 0 );
        for ( i = 1; i < nVars-1; i++ )
            fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=%0*d\n", nDigits, i, nDigits, i, nDigits, i-1, nDigits, i, nDigits, i );
        fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=s%0*d\n", nDigits, i, nDigits, i, nDigits, i-1, nDigits, i, nDigits, i+1 );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteFullAdder( pFile );
}